

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_access_chain_convert_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LocalAccessChainConvertPass::GenAccessChainStoreReplacement
          (LocalAccessChainConvertPass *this,Instruction *ptrInst,uint32_t valId,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *newInsts)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<spv::Decoration> __l_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<spvtools::opt::Operand> __l_01;
  initializer_list<spv::Decoration> __l_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  initializer_list<spvtools::opt::Operand> __l_03;
  uint32_t uVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  DecorationManager *pDVar4;
  Operand *local_420;
  Operand *local_400;
  Operand *local_3d0;
  allocator<spvtools::opt::Operand> local_3bd;
  uint32_t local_3bc;
  iterator local_3b8;
  undefined8 local_3b0;
  SmallVector<unsigned_int,_2UL> local_3a8;
  uint32_t local_37c;
  iterator local_378;
  undefined8 local_370;
  SmallVector<unsigned_int,_2UL> local_368;
  Operand local_340;
  Operand OStack_310;
  iterator local_2e0;
  _func_int **local_2d8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_2d0;
  allocator<spv::Decoration> local_2b5;
  Decoration local_2b4;
  iterator local_2b0;
  size_type local_2a8;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> local_2a0;
  allocator<spvtools::opt::Operand> local_285;
  uint32_t local_284;
  iterator local_280;
  undefined8 local_278;
  SmallVector<unsigned_int,_2UL> local_270;
  uint32_t local_244;
  iterator local_240;
  undefined8 local_238;
  SmallVector<unsigned_int,_2UL> local_230;
  Operand local_208;
  Operand OStack_1d8;
  iterator local_1a8;
  _func_int **local_1a0;
  undefined1 local_198 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ins_in_opnds;
  allocator<spv::Decoration> local_175;
  uint32_t insResultId;
  iterator local_170;
  size_type local_168;
  vector<spv::Decoration,_std::allocator<spv::Decoration>_> local_160;
  uint32_t local_144;
  uint32_t local_140;
  uint32_t ldResultId;
  uint32_t varPteTypeId;
  uint32_t varId;
  iterator local_130;
  undefined8 local_128;
  SmallVector<unsigned_int,_2UL> local_120;
  uint32_t local_f4;
  iterator local_f0;
  undefined8 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  Operand local_b8;
  Operand OStack_88;
  iterator local_58;
  _func_int **local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_30;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *newInsts_local;
  Instruction *pIStack_20;
  uint32_t valId_local;
  Instruction *ptrInst_local;
  LocalAccessChainConvertPass *this_local;
  
  local_30._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)newInsts;
  newInsts_local._4_4_ = valId;
  pIStack_20 = ptrInst;
  ptrInst_local = (Instruction *)this;
  uVar2 = opt::Instruction::NumInOperands(ptrInst);
  if (uVar2 == 1) {
    local_f4 = opt::Instruction::GetSingleWordInOperand(pIStack_20,0);
    local_f0 = &local_f4;
    local_e8 = 1;
    init_list_04._M_len = 1;
    init_list_04._M_array = local_f0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_04);
    Operand::Operand(&local_b8,SPV_OPERAND_TYPE_ID,&local_e0);
    varId = newInsts_local._4_4_;
    local_130 = &varId;
    local_128 = 1;
    init_list_03._M_len = 1;
    init_list_03._M_array = local_130;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_120,init_list_03);
    Operand::Operand(&OStack_88,SPV_OPERAND_TYPE_ID,&local_120);
    local_58 = &local_b8;
    local_50 = (_func_int **)0x2;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)((long)&varPteTypeId + 3));
    __l_03._M_len = (size_type)local_50;
    __l_03._M_array = local_58;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_48,__l_03,(allocator_type *)((long)&varPteTypeId + 3));
    BuildAndAppendInst(this,OpStore,0,0,&local_48,
                       (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        *)local_30._M_head_impl);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)((long)&varPteTypeId + 3));
    local_3d0 = (Operand *)&local_58;
    do {
      local_3d0 = local_3d0 + -1;
      Operand::~Operand(local_3d0);
    } while (local_3d0 != &local_b8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_120);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
    this_local._7_1_ = 1;
  }
  else {
    local_144 = BuildAndAppendVarLoad
                          (this,pIStack_20,&ldResultId,&local_140,
                           (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                            *)local_30._M_head_impl);
    if (local_144 == 0) {
      this_local._7_1_ = 0;
    }
    else {
      pIVar3 = Pass::context((Pass *)this);
      pDVar4 = IRContext::get_decoration_mgr(pIVar3);
      uVar1 = ldResultId;
      uVar2 = local_144;
      insResultId = 0;
      local_170 = &insResultId;
      local_168 = 1;
      std::allocator<spv::Decoration>::allocator(&local_175);
      __l_02._M_len = local_168;
      __l_02._M_array = local_170;
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::vector
                (&local_160,__l_02,&local_175);
      analysis::DecorationManager::CloneDecorations(pDVar4,uVar1,uVar2,&local_160);
      std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::~vector(&local_160);
      std::allocator<spv::Decoration>::~allocator(&local_175);
      ins_in_opnds.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = Pass::TakeNextId((Pass *)this);
      if (ins_in_opnds.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
        this_local._7_1_ = 0;
      }
      else {
        local_244 = newInsts_local._4_4_;
        local_240 = &local_244;
        local_238 = 1;
        init_list_02._M_len = 1;
        init_list_02._M_array = local_240;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_230,init_list_02);
        Operand::Operand(&local_208,SPV_OPERAND_TYPE_ID,&local_230);
        local_284 = local_144;
        local_280 = &local_284;
        local_278 = 1;
        init_list_01._M_len = 1;
        init_list_01._M_array = local_280;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_270,init_list_01);
        Operand::Operand(&OStack_1d8,SPV_OPERAND_TYPE_ID,&local_270);
        local_1a8 = &local_208;
        local_1a0 = (_func_int **)0x2;
        std::allocator<spvtools::opt::Operand>::allocator(&local_285);
        __l_01._M_len = (size_type)local_1a0;
        __l_01._M_array = local_1a8;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_198,__l_01,&local_285);
        std::allocator<spvtools::opt::Operand>::~allocator(&local_285);
        local_400 = (Operand *)&local_1a8;
        do {
          local_400 = local_400 + -1;
          Operand::~Operand(local_400);
        } while (local_400 != &local_208);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_270);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_230);
        AppendConstantOperands
                  (this,pIStack_20,
                   (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_198);
        BuildAndAppendInst(this,OpCompositeInsert,local_140,
                           ins_in_opnds.
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)local_198,
                           (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                            *)local_30._M_head_impl);
        pIVar3 = Pass::context((Pass *)this);
        pDVar4 = IRContext::get_decoration_mgr(pIVar3);
        uVar1 = ldResultId;
        uVar2 = ins_in_opnds.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        local_2b4 = DecorationRelaxedPrecision;
        local_2b0 = &local_2b4;
        local_2a8 = 1;
        std::allocator<spv::Decoration>::allocator(&local_2b5);
        __l_00._M_len = local_2a8;
        __l_00._M_array = local_2b0;
        std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::vector
                  (&local_2a0,__l_00,&local_2b5);
        analysis::DecorationManager::CloneDecorations(pDVar4,uVar1,uVar2,&local_2a0);
        std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>::~vector(&local_2a0);
        std::allocator<spv::Decoration>::~allocator(&local_2b5);
        local_37c = ldResultId;
        local_378 = &local_37c;
        local_370 = 1;
        init_list_00._M_len = 1;
        init_list_00._M_array = local_378;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_368,init_list_00);
        Operand::Operand(&local_340,SPV_OPERAND_TYPE_ID,&local_368);
        local_3bc = ins_in_opnds.
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        local_3b8 = &local_3bc;
        local_3b0 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_3b8;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_3a8,init_list);
        Operand::Operand(&OStack_310,SPV_OPERAND_TYPE_ID,&local_3a8);
        local_2e0 = &local_340;
        local_2d8 = (_func_int **)0x2;
        std::allocator<spvtools::opt::Operand>::allocator(&local_3bd);
        __l._M_len = (size_type)local_2d8;
        __l._M_array = local_2e0;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  (&local_2d0,__l,&local_3bd);
        BuildAndAppendInst(this,OpStore,0,0,&local_2d0,
                           (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                            *)local_30._M_head_impl);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_2d0);
        std::allocator<spvtools::opt::Operand>::~allocator(&local_3bd);
        local_420 = (Operand *)&local_2e0;
        do {
          local_420 = local_420 + -1;
          Operand::~Operand(local_420);
        } while (local_420 != &local_340);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_3a8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_368);
        this_local._7_1_ = 1;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_198);
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LocalAccessChainConvertPass::GenAccessChainStoreReplacement(
    const Instruction* ptrInst, uint32_t valId,
    std::vector<std::unique_ptr<Instruction>>* newInsts) {
  if (ptrInst->NumInOperands() == 1) {
    // An access chain with no indices is essentially a copy.  However, we still
    // have to create a new store because the old ones will be deleted.
    BuildAndAppendInst(
        spv::Op::OpStore, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID,
          {ptrInst->GetSingleWordInOperand(kAccessChainPtrIdInIdx)}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}}},
        newInsts);
    return true;
  }

  // Build and append load of variable in ptrInst
  uint32_t varId;
  uint32_t varPteTypeId;
  const uint32_t ldResultId =
      BuildAndAppendVarLoad(ptrInst, &varId, &varPteTypeId, newInsts);
  if (ldResultId == 0) {
    return false;
  }

  context()->get_decoration_mgr()->CloneDecorations(
      varId, ldResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Insert
  const uint32_t insResultId = TakeNextId();
  if (insResultId == 0) {
    return false;
  }
  std::vector<Operand> ins_in_opnds = {
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {valId}},
      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {ldResultId}}};
  AppendConstantOperands(ptrInst, &ins_in_opnds);
  BuildAndAppendInst(spv::Op::OpCompositeInsert, varPteTypeId, insResultId,
                     ins_in_opnds, newInsts);

  context()->get_decoration_mgr()->CloneDecorations(
      varId, insResultId, {spv::Decoration::RelaxedPrecision});

  // Build and append Store
  BuildAndAppendInst(spv::Op::OpStore, 0, 0,
                     {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {varId}},
                      {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {insResultId}}},
                     newInsts);
  return true;
}